

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  _Bool local_25;
  char test;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    cVar1 = '\0';
  }
  else {
    cVar1 = *argv[1];
  }
  if (cVar1 == 'n') {
    _Var2 = uo_json_encode_number_test();
    argv_local._4_4_ = (uint)!_Var2;
  }
  else if (cVar1 == 'u') {
    _Var2 = uo_json_encode_utf8_test();
    argv_local._4_4_ = (uint)!_Var2;
  }
  else {
    _Var2 = uo_json_encode_number_test();
    local_25 = false;
    if (_Var2) {
      local_25 = uo_json_encode_utf8_test();
    }
    argv_local._4_4_ = (uint)(local_25 == false);
  }
  return argv_local._4_4_;
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    char test = argc > 1
        ? argv[1][0]
        : '\0';

    switch (test)
    {
        case 'n': return uo_json_encode_number_test() ? 0 : 1;
        case 'u': return uo_json_encode_utf8_test() ? 0 : 1;
        default: return uo_json_encode_number_test()
            && uo_json_encode_utf8_test() ? 0 : 1;
    }
}